

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

void __thiscall QDockWidget::paintEvent(QDockWidget *this,QPaintEvent *event)

{
  undefined1 uVar1;
  bool bVar2;
  QDockWidgetPrivate *pQVar3;
  QDockWidgetLayout *this_00;
  QWidget *pQVar4;
  QFont *this_01;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  byte bVar5;
  bool nativeDeco;
  bool customTitleBar;
  QDockWidgetLayout *layout;
  QDockWidgetPrivate *d;
  QStylePainter p;
  QStyleOptionDockWidget titleOpt;
  QStyleOptionFrame framOpt;
  undefined8 in_stack_fffffffffffffed8;
  PrimitiveElement pe;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  QFontMetrics local_e8 [8];
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  QFont local_c8 [16];
  undefined1 local_b8 [96];
  undefined1 local_58 [80];
  long local_8;
  
  pe = (PrimitiveElement)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QDockWidget *)0x58fef5);
  QWidget::layout((QWidget *)0x58ff04);
  this_00 = qobject_cast<QDockWidgetLayout*>((QObject *)0x58ff0c);
  pQVar4 = QDockWidgetLayout::widgetForRole
                     ((QDockWidgetLayout *)
                      CONCAT17(in_stack_fffffffffffffef7,
                               CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
                      (Role)((ulong)in_RDI >> 0x20));
  bVar5 = pQVar4 != (QWidget *)0x0;
  uVar1 = QDockWidgetLayout::nativeWindowDeco
                    ((QDockWidgetLayout *)
                     CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
  if ((!(bool)uVar1) && ((bVar5 & 1) == 0)) {
    local_e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    local_d0 = &DAT_aaaaaaaaaaaaaaaa;
    QStylePainter::QStylePainter
              ((QStylePainter *)CONCAT17(bVar5,CONCAT16(uVar1,in_stack_fffffffffffffef0)),in_RDI);
    bVar2 = isFloating((QDockWidget *)0x58ff90);
    if (bVar2) {
      memset(local_58,0xaa,0x50);
      QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x58ffba);
      QStyleOption::initFrom
                ((QStyleOption *)this_00,
                 (QWidget *)CONCAT17(bVar5,CONCAT16(uVar1,in_stack_fffffffffffffef0)));
      QStylePainter::drawPrimitive
                ((QStylePainter *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),pe,
                 (QStyleOption *)0x58ffe3);
      QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x58fff0);
    }
    memset(local_b8,0xaa,0x60);
    QStyleOptionDockWidget::QStyleOptionDockWidget((QStyleOptionDockWidget *)0x59000e);
    (**(code **)(*(long *)in_RDI + 0x1a0))(in_RDI,local_b8);
    this_01 = QWidget::font(in_RDI);
    QApplication::font((char *)this_00);
    bVar5 = QFont::operator==(this_01,local_c8);
    QFont::~QFont(local_c8);
    if ((bVar5 & 1) != 0) {
      QFontMetrics::QFontMetrics(local_e8,&pQVar3->font);
      QFontMetrics::operator=
                ((QFontMetrics *)CONCAT17(bVar5,in_stack_fffffffffffffee0),(QFontMetrics *)this_01);
      QFontMetrics::~QFontMetrics(local_e8);
      QPainter::setFont((QFont *)&local_e0);
    }
    QStylePainter::drawControl
              ((QStylePainter *)CONCAT17(bVar5,in_stack_fffffffffffffee0),
               (ControlElement)((ulong)this_01 >> 0x20),(QStyleOption *)0x5900c3);
    QStyleOptionDockWidget::~QStyleOptionDockWidget
              ((QStyleOptionDockWidget *)CONCAT17(bVar5,in_stack_fffffffffffffee0));
    QStylePainter::~QStylePainter((QStylePainter *)0x5900d7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockWidget::paintEvent(QPaintEvent *event)
{
    Q_UNUSED(event);
    Q_D(QDockWidget);

    QDockWidgetLayout *layout
        = qobject_cast<QDockWidgetLayout*>(this->layout());
    bool customTitleBar = layout->widgetForRole(QDockWidgetLayout::TitleBar) != nullptr;
    bool nativeDeco = layout->nativeWindowDeco();

    if (!nativeDeco && !customTitleBar) {
        QStylePainter p(this);
        // ### Add PixelMetric to change spacers, so style may show border
        // when not floating.
        if (isFloating()) {
            QStyleOptionFrame framOpt;
            framOpt.initFrom(this);
            p.drawPrimitive(QStyle::PE_FrameDockWidget, framOpt);
        }

        // Title must be painted after the frame, since the areas overlap, and
        // the title may wish to extend out to all sides (eg. Vista style)
        QStyleOptionDockWidget titleOpt;
        initStyleOption(&titleOpt);
        if (font() == QApplication::font("QDockWidget")) {
            titleOpt.fontMetrics = QFontMetrics(d->font);
            p.setFont(d->font);
        }

        p.drawControl(QStyle::CE_DockWidgetTitle, titleOpt);
    }
}